

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void CServerBrowser::CBFTrackPacket(int TrackID,void *pCallbackUser)

{
  long lVar1;
  int64 iVar2;
  long *plVar3;
  
  if (pCallbackUser != (void *)0x0) {
    plVar3 = (long *)((long)pCallbackUser + 0xce38);
    while (lVar1 = *plVar3, lVar1 != 0) {
      if (*(int *)(lVar1 + 0x28) == TrackID) {
        iVar2 = time_get();
        *(int64 *)(lVar1 + 0x18) = iVar2;
        return;
      }
      plVar3 = (long *)(lVar1 + 0x22c8);
    }
  }
  return;
}

Assistant:

void CServerBrowser::CBFTrackPacket(int TrackID, void *pCallbackUser)
{
	if(!pCallbackUser)
		return;

	CServerBrowser *pSelf = (CServerBrowser *)pCallbackUser;
	CServerEntry *pEntry = pSelf->m_pFirstReqServer;
	while(1)
	{
		if(!pEntry)	// no more entries
			break;

		if(pEntry->m_TrackID == TrackID)	// got it -> update
		{
			pEntry->m_RequestTime = time_get();
			break;
		}

		pEntry = pEntry->m_pNextReq;
	}
}